

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http_public.c
# Opt level: O2

void nng_http_set_status(nng_http *conn,nng_http_status status,char *reason)

{
  nni_http_set_status(conn,status,reason);
  return;
}

Assistant:

void
nng_http_set_status(nng_http *conn, nng_http_status status, const char *reason)
{
#ifdef NNG_SUPP_HTTP
	nni_http_set_status(conn, status, reason);
#else
	NNI_ARG_UNUSED(res);
	NNI_ARG_UNUSED(status);
	NNI_ARG_UNUSED(reason);
#endif
}